

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O0

activity_stats_t * __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
::take_stats(activity_stats_t *__return_storage_ptr__,
            stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
            *this)

{
  bool bVar1;
  external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
  *__m;
  activity_stats_t *result;
  lock_guard<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
  local_28;
  take_stats_lock_t lock;
  time_point work_started_at;
  bool is_in_working;
  stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
  *this_local;
  
  activity_stats_t::activity_stats_t(__return_storage_ptr__);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&lock);
  __m = lock_holder(this);
  std::
  lock_guard<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
  ::lock_guard(&local_28,__m);
  __return_storage_ptr__->m_count = (this->m_work_activity).m_count;
  (__return_storage_ptr__->m_total_time).__r = (this->m_work_activity).m_total_time.__r;
  (__return_storage_ptr__->m_avg_time).__r = (this->m_work_activity).m_avg_time.__r;
  bVar1 = this->m_is_in_working;
  if ((bVar1 & 1U) == 1) {
    lock._M_device = (mutex_type *)(this->m_work_started_at).__d.__r;
  }
  std::
  lock_guard<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
  ::~lock_guard(&local_28);
  if ((bVar1 & 1U) != 0) {
    details::update_stats_from_current_time(__return_storage_ptr__,(time_point)lock._M_device);
  }
  return __return_storage_ptr__;
}

Assistant:

so_5::stats::activity_stats_t
		take_stats()
			{
				so_5::stats::activity_stats_t result;
				bool is_in_working{ false };
				so_5::stats::clock_type_t::time_point work_started_at;

				{
					typename LOCK_HOLDER::take_stats_lock_t lock{ lock_holder() };

					result = m_work_activity;
					if( true == (is_in_working = m_is_in_working) )
						work_started_at = m_work_started_at;
				}

				if( is_in_working )
					so_5::stats::details::update_stats_from_current_time(
							result,
							work_started_at );

				return result;
			}